

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

int smf_get_length_pulses(smf_t *smf)

{
  smf_track_t *track_00;
  smf_event_t *psVar1;
  smf_event_t *event;
  smf_track_t *track;
  int i;
  int pulses;
  smf_t *smf_local;
  
  track._4_4_ = 0;
  track._0_4_ = 1;
  while( true ) {
    if (smf->number_of_tracks < (int)track) {
      return track._4_4_;
    }
    track_00 = smf_get_track_by_number(smf,(int)track);
    if (track_00 == (smf_track_t *)0x0) break;
    psVar1 = smf_track_get_last_event(track_00);
    if ((psVar1 != (smf_event_t *)0x0) && (track._4_4_ < psVar1->time_pulses)) {
      track._4_4_ = psVar1->time_pulses;
    }
    track._0_4_ = (int)track + 1;
  }
  __assert_fail("track",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x418,"int smf_get_length_pulses(const smf_t *)");
}

Assistant:

int
smf_get_length_pulses(const smf_t *smf)
{
	int pulses = 0, i;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		smf_track_t *track;
		smf_event_t *event;

	       	track = smf_get_track_by_number(smf, i);
		assert(track);

		event = smf_track_get_last_event(track);
		/* Empty track? */
		if (event == NULL)
			continue;

		if (event->time_pulses > pulses)
			pulses = event->time_pulses;
	}

	return (pulses);
}